

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::api::json::PsbtScriptData::PsbtScriptData(PsbtScriptData *this,PsbtScriptData *param_2)

{
  JsonClassBase<cfd::api::json::PsbtScriptData> *in_RSI;
  JsonClassBase<cfd::api::json::PsbtScriptData> *in_RDI;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc0;
  
  core::JsonClassBase<cfd::api::json::PsbtScriptData>::JsonClassBase(in_RDI,in_RSI);
  in_RDI->_vptr_JsonClassBase = (_func_int **)&PTR__PsbtScriptData_005801d0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::__cxx11::string::string((string *)(in_RDI + 7),(string *)(in_RSI + 7));
  std::__cxx11::string::string((string *)(in_RDI + 0xb),(string *)(in_RSI + 0xb));
  std::__cxx11::string::string((string *)(in_RDI + 0xf),(string *)(in_RSI + 0xf));
  return;
}

Assistant:

PsbtScriptData() {
    CollectFieldName();
  }